

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O2

void __thiscall
google::protobuf::util::anon_unknown_1::DescriptorPoolTypeResolver::~DescriptorPoolTypeResolver
          (DescriptorPoolTypeResolver *this)

{
  (this->super_TypeResolver)._vptr_TypeResolver =
       (_func_int **)&PTR__DescriptorPoolTypeResolver_003e4560;
  std::__cxx11::string::~string((string *)&this->url_prefix_);
  return;
}

Assistant:

DescriptorPoolTypeResolver(const std::string& url_prefix,
                             const DescriptorPool* pool)
      : url_prefix_(url_prefix), pool_(pool) {}